

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_barrier.cpp
# Opt level: O0

bool __kmp_linear_barrier_release_template<true>
               (barrier_type bt,kmp_info_t *this_thr,int gtid,int tid,int propagate_icvs,
               void *itt_sync_obj)

{
  uint uVar1;
  bool bVar2;
  void *pvVar3;
  int in_ECX;
  long in_RSI;
  uint in_EDI;
  int in_R8D;
  long in_R9;
  bool cancelled;
  kmp_flag_64 flag_1;
  kmp_flag_64 flag;
  kmp_info_t **other_threads;
  kmp_uint32 nproc;
  uint i;
  kmp_team_t *team;
  kmp_bstate_t *thr_bar;
  kmp_internal_control_t *in_stack_ffffffffffffff58;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  void *in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff74;
  int in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  kmp_team_t *in_stack_ffffffffffffff80;
  kmp_info_t *in_stack_ffffffffffffff88;
  ident_t *in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  int in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  uint local_3c;
  
  if (in_ECX == 0) {
    uVar1 = *(uint *)(in_RSI + 100);
    if (1 < uVar1) {
      if (in_R8D != 0) {
        for (local_3c = 1; local_3c < uVar1; local_3c = local_3c + 1) {
          __kmp_init_implicit_task
                    (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                     in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78);
          copy_icvs((kmp_internal_control_t *)
                    CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                    in_stack_ffffffffffffff58);
        }
      }
      for (local_3c = 1; local_3c < uVar1; local_3c = local_3c + 1) {
        kmp_flag_64::kmp_flag_64
                  ((kmp_flag_64 *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                   (kmp_uint64 *)in_stack_ffffffffffffff58,(kmp_info_t *)0x17d562);
        kmp_flag_64::release((kmp_flag_64 *)0x17d56c);
      }
    }
  }
  else {
    kmp_flag_64::kmp_flag_64
              ((kmp_flag_64 *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
               (kmp_uint64 *)in_stack_ffffffffffffff58,0x17d598);
    bVar2 = kmp_flag_64::wait_cancellable_nosleep
                      ((kmp_flag_64 *)&in_stack_ffffffffffffff80->t,
                       (kmp_info_t *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                       in_stack_ffffffffffffff74,in_stack_ffffffffffffff68);
    if (bVar2) {
      return true;
    }
    if ((__kmp_itt_sync_create_ptr__3_0 == (undefined1 *)0x0) || (in_R9 != 0)) {
      if ((in_EDI == 1) && (__kmp_global.g.g_done != 0)) {
        return false;
      }
    }
    else {
      __kmp_itt_barrier_object
                (in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
                 in_stack_ffffffffffffffa8);
      __kmp_itt_task_starting((void *)0x17d61e);
      if ((in_EDI == 1) && (__kmp_global.g.g_done != 0)) {
        return false;
      }
      pvVar3 = __kmp_itt_barrier_object
                         (in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0,
                          in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
      if (pvVar3 != (void *)0x0) {
        __kmp_itt_task_finished((void *)0x17d676);
      }
    }
    *(undefined8 *)(in_RSI + (ulong)in_EDI * 0xc0 + 0x230) = 0;
  }
  return false;
}

Assistant:

static bool __kmp_linear_barrier_release_template(
    enum barrier_type bt, kmp_info_t *this_thr, int gtid, int tid,
    int propagate_icvs USE_ITT_BUILD_ARG(void *itt_sync_obj)) {
  KMP_TIME_DEVELOPER_PARTITIONED_BLOCK(KMP_linear_release);
  kmp_bstate_t *thr_bar = &this_thr->th.th_bar[bt].bb;
  kmp_team_t *team;

  if (KMP_MASTER_TID(tid)) {
    unsigned int i;
    kmp_uint32 nproc = this_thr->th.th_team_nproc;
    kmp_info_t **other_threads;

    team = __kmp_threads[gtid]->th.th_team;
    KMP_DEBUG_ASSERT(team != NULL);
    other_threads = team->t.t_threads;

    KA_TRACE(20, ("__kmp_linear_barrier_release: T#%d(%d:%d) master enter for "
                  "barrier type %d\n",
                  gtid, team->t.t_id, tid, bt));

    if (nproc > 1) {
#if KMP_BARRIER_ICV_PUSH
      {
        KMP_TIME_DEVELOPER_PARTITIONED_BLOCK(USER_icv_copy);
        if (propagate_icvs) {
          ngo_load(&team->t.t_implicit_task_taskdata[0].td_icvs);
          for (i = 1; i < nproc; ++i) {
            __kmp_init_implicit_task(team->t.t_ident, team->t.t_threads[i],
                                     team, i, FALSE);
            ngo_store_icvs(&team->t.t_implicit_task_taskdata[i].td_icvs,
                           &team->t.t_implicit_task_taskdata[0].td_icvs);
          }
          ngo_sync();
        }
      }
#endif // KMP_BARRIER_ICV_PUSH

      // Now, release all of the worker threads
      for (i = 1; i < nproc; ++i) {
#if KMP_CACHE_MANAGE
        // Prefetch next thread's go flag
        if (i + 1 < nproc)
          KMP_CACHE_PREFETCH(&other_threads[i + 1]->th.th_bar[bt].bb.b_go);
#endif /* KMP_CACHE_MANAGE */
        KA_TRACE(
            20,
            ("__kmp_linear_barrier_release: T#%d(%d:%d) releasing T#%d(%d:%d) "
             "go(%p): %u => %u\n",
             gtid, team->t.t_id, tid, other_threads[i]->th.th_info.ds.ds_gtid,
             team->t.t_id, i, &other_threads[i]->th.th_bar[bt].bb.b_go,
             other_threads[i]->th.th_bar[bt].bb.b_go,
             other_threads[i]->th.th_bar[bt].bb.b_go + KMP_BARRIER_STATE_BUMP));
        ANNOTATE_BARRIER_BEGIN(other_threads[i]);
        kmp_flag_64 flag(&other_threads[i]->th.th_bar[bt].bb.b_go,
                         other_threads[i]);
        flag.release();
      }
    }
  } else { // Wait for the MASTER thread to release us
    KA_TRACE(20, ("__kmp_linear_barrier_release: T#%d wait go(%p) == %u\n",
                  gtid, &thr_bar->b_go, KMP_BARRIER_STATE_BUMP));
    kmp_flag_64 flag(&thr_bar->b_go, KMP_BARRIER_STATE_BUMP);
    if (cancellable) {
      bool cancelled = flag.wait_cancellable_nosleep(
          this_thr, TRUE USE_ITT_BUILD_ARG(itt_sync_obj));
      if (cancelled) {
        return true;
      }
    } else {
      flag.wait(this_thr, TRUE USE_ITT_BUILD_ARG(itt_sync_obj));
    }
    ANNOTATE_BARRIER_END(this_thr);
#if USE_ITT_BUILD && USE_ITT_NOTIFY
    if ((__itt_sync_create_ptr && itt_sync_obj == NULL) || KMP_ITT_DEBUG) {
      // In a fork barrier; cannot get the object reliably (or ITTNOTIFY is
      // disabled)
      itt_sync_obj = __kmp_itt_barrier_object(gtid, bs_forkjoin_barrier, 0, -1);
      // Cancel wait on previous parallel region...
      __kmp_itt_task_starting(itt_sync_obj);

      if (bt == bs_forkjoin_barrier && TCR_4(__kmp_global.g.g_done))
        return false;

      itt_sync_obj = __kmp_itt_barrier_object(gtid, bs_forkjoin_barrier);
      if (itt_sync_obj != NULL)
        // Call prepare as early as possible for "new" barrier
        __kmp_itt_task_finished(itt_sync_obj);
    } else
#endif /* USE_ITT_BUILD && USE_ITT_NOTIFY */
        // Early exit for reaping threads releasing forkjoin barrier
        if (bt == bs_forkjoin_barrier && TCR_4(__kmp_global.g.g_done))
      return false;
// The worker thread may now assume that the team is valid.
#ifdef KMP_DEBUG
    tid = __kmp_tid_from_gtid(gtid);
    team = __kmp_threads[gtid]->th.th_team;
#endif
    KMP_DEBUG_ASSERT(team != NULL);
    TCW_4(thr_bar->b_go, KMP_INIT_BARRIER_STATE);
    KA_TRACE(20,
             ("__kmp_linear_barrier_release: T#%d(%d:%d) set go(%p) = %u\n",
              gtid, team->t.t_id, tid, &thr_bar->b_go, KMP_INIT_BARRIER_STATE));
    KMP_MB(); // Flush all pending memory write invalidates.
  }
  KA_TRACE(
      20,
      ("__kmp_linear_barrier_release: T#%d(%d:%d) exit for barrier type %d\n",
       gtid, team->t.t_id, tid, bt));
  return false;
}